

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_contexts.hpp
# Opt level: O0

void __thiscall timing_registry::registerTask(timing_registry *this,uint64_t uid,string *name)

{
  mapped_type *this_00;
  mapped_type *h;
  lock_guard<std::recursive_mutex> __l;
  int64_t t;
  string *name_local;
  uint64_t uid_local;
  timing_registry *this_local;
  
  name_local = (string *)uid;
  uid_local = (uint64_t)this;
  __l._M_device = (mutex_type *)query_performance_counter();
  std::lock_guard<std::recursive_mutex>::lock_guard((lock_guard<std::recursive_mutex> *)&h,&this->m)
  ;
  this_00 = std::
            unordered_map<unsigned_long,_timing_registry::task_info,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_timing_registry::task_info>_>_>
            ::operator[](&this->tasks,(key_type *)&name_local);
  std::__cxx11::string::operator=((string *)this_00,(string *)name);
  this_00->createdAt = (int64_t)__l._M_device;
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)&h);
  return;
}

Assistant:

void registerTask(uint64_t uid, const std::string &name)
    {
        auto t = query_performance_counter();
        std::lock_guard<std::recursive_mutex> __l(m);
        auto &h = tasks[uid];
        h.name = name;
        h.createdAt = t;
    }